

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonReturn(JsonNode *pNode,sqlite3_context *pCtx,sqlite3_value **aReplace)

{
  char cVar1;
  u32 uVar2;
  JsonNode *pJVar3;
  u32 uVar4;
  u32 uVar5;
  size_t sVar6;
  u8 *z;
  long lVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  long val;
  Mem *pMVar12;
  code *xDel;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  char *__s;
  uint uVar17;
  ulong uVar18;
  double r;
  double local_38;
  
  switch(pNode->eType) {
  case '\x01':
    pMVar12 = pCtx->pOut;
    if ((pMVar12->flags & 0x9000) != 0) {
      val = 1;
LAB_001bfb11:
      vdbeReleaseAndSetInt64(pMVar12,val);
      return;
    }
    (pMVar12->u).r = 4.94065645841247e-324;
    break;
  case '\x02':
    pMVar12 = pCtx->pOut;
    if ((pMVar12->flags & 0x9000) != 0) {
      val = 0;
      goto LAB_001bfb11;
    }
    (pMVar12->u).r = 0.0;
    break;
  case '\x03':
    __s = (pNode->u).zJContent;
    cVar1 = *__s;
    cVar8 = __s[cVar1 == '-'];
    if ((byte)(cVar8 - 0x30U) < 10) {
      pcVar11 = __s + (cVar1 == '-');
      lVar7 = 0;
      do {
        pcVar11 = pcVar11 + 1;
        bVar13 = cVar8 - 0x30;
        if (0xccccccccccccccb < lVar7) {
          if ((lVar7 != 0xccccccccccccccc) || ((byte)(*pcVar11 - 0x30U) < 10)) goto LAB_001bf848;
          if (cVar8 == '8') {
            if (cVar1 != '-') goto LAB_001bf848;
            val = -0x8000000000000000;
            goto LAB_001bfb08;
          }
          if (cVar8 == '9') goto LAB_001bf848;
          lVar7 = (ulong)bVar13 + 0x7ffffffffffffff8;
          break;
        }
        cVar8 = *pcVar11;
        lVar7 = (ulong)bVar13 + lVar7 * 10;
      } while ((byte)(cVar8 - 0x30U) < 10);
    }
    else {
      lVar7 = 0;
    }
    val = -lVar7;
    if (cVar1 != '-') {
      val = lVar7;
    }
LAB_001bfb08:
    pMVar12 = pCtx->pOut;
    if ((pMVar12->flags & 0x9000) != 0) goto LAB_001bfb11;
    (pMVar12->u).i = val;
    break;
  case '\x04':
    __s = (pNode->u).zJContent;
LAB_001bf848:
    if (__s == (char *)0x0) {
      uVar10 = 0;
    }
    else {
      sVar6 = strlen(__s);
      uVar10 = (uint)sVar6 & 0x3fffffff;
    }
    sqlite3AtoF(__s,&local_38,uVar10,'\x01');
    sqlite3VdbeMemSetDouble(pCtx->pOut,local_38);
    return;
  case '\x05':
    if ((pNode->jnFlags & 2) == 0) {
      z = &((pNode->u).pPatch)->jnFlags;
      iVar9 = pNode->n - 2;
      xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    }
    else {
      uVar2 = pNode->n;
      pJVar3 = (pNode->u).pPatch;
      z = (u8 *)sqlite3_malloc(uVar2 + 1);
      if (z == (u8 *)0x0) {
        sqlite3_result_error_nomem(pCtx);
        return;
      }
      uVar18 = 0;
      if (1 < uVar2 - 1) {
        uVar15 = 1;
        uVar18 = 0;
        do {
          uVar14 = (uint)uVar15;
          bVar13 = (&pJVar3->eType)[uVar15];
          uVar17 = (uint)uVar18;
          uVar10 = uVar17;
          if (bVar13 == 0x5c) {
            uVar16 = uVar14 + 1;
            bVar13 = (&pJVar3->jnFlags)[uVar15];
            if (bVar13 < 0x6e) {
              uVar4 = 8;
              if (bVar13 != 0x62) {
                if (bVar13 != 0x66) {
LAB_001bf9d7:
                  if (bVar13 == 0x74) {
                    bVar13 = 9;
                  }
                  iVar9 = 1;
                  uVar14 = uVar16;
                  goto LAB_001bf9ba;
                }
                uVar4 = 0xc;
              }
            }
            else if (bVar13 == 0x6e) {
              uVar4 = 10;
            }
            else if (bVar13 == 0x72) {
              uVar4 = 0xd;
            }
            else {
              if (bVar13 != 0x75) goto LAB_001bf9d7;
              uVar4 = jsonHexToInt4((char *)(&pJVar3->eU + uVar15));
              if (uVar4 == 0) break;
              uVar16 = uVar14 + 5;
              if (0x7f < uVar4) {
                if (uVar4 < 0x800) {
                  z[uVar18] = (byte)(uVar4 >> 6) | 0xc0;
                  bVar13 = (byte)uVar4 & 0x3f | 0x80;
                  iVar9 = 2;
                  uVar10 = uVar17 + 1;
                  uVar14 = uVar16;
                }
                else if ((((uVar16 < uVar2 - 6) && ((uVar4 & 0xfc00) == 0xd800)) &&
                         ((&pJVar3->eType)[uVar14 + 6] == '\\')) &&
                        (((&pJVar3->eType)[uVar14 + 7] == 'u' &&
                         (uVar5 = jsonHexToInt4(&pJVar3->field_0x3 + uVar16),
                         (uVar5 & 0xfc00) == 0xdc00)))) {
                  uVar16 = (uVar4 & 0x3ff) * 0x400;
                  uVar10 = (uVar5 & 0x3ff) + uVar16 + 0x10000;
                  uVar14 = uVar14 + 0xb;
                  z[uVar18] = (byte)(uVar10 >> 0x12) | 0xf0;
                  z[uVar17 + 1] = (byte)(uVar10 >> 0xc) & 0x3f | 0x80;
                  z[uVar17 + 2] = (byte)((uVar5 & 0x3ff | uVar16) >> 6) & 0x3f | 0x80;
                  bVar13 = (byte)uVar5 & 0x3f | 0x80;
                  iVar9 = 4;
                  uVar10 = uVar17 + 3;
                }
                else {
                  z[uVar18] = (byte)(uVar4 >> 0xc) | 0xe0;
                  z[uVar17 + 1] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
                  bVar13 = (byte)uVar4 & 0x3f | 0x80;
                  iVar9 = 3;
                  uVar10 = uVar17 + 2;
                  uVar14 = uVar16;
                }
                goto LAB_001bf9ba;
              }
            }
            bVar13 = (byte)uVar4;
            iVar9 = 1;
            uVar14 = uVar16;
          }
          else {
            iVar9 = 1;
          }
LAB_001bf9ba:
          uVar18 = (ulong)(uVar17 + iVar9);
          z[uVar10] = bVar13;
          uVar15 = (ulong)(uVar14 + 1);
        } while (uVar14 + 1 < uVar2 - 1);
      }
      iVar9 = (int)uVar18;
      z[uVar18] = '\0';
      xDel = sqlite3_free;
    }
    setResultStrOrError(pCtx,(char *)z,iVar9,'\x01',xDel);
    return;
  case '\x06':
  case '\a':
    jsonReturnJson(pNode,pCtx,(sqlite3_value **)0x0);
    return;
  default:
    pMVar12 = pCtx->pOut;
    if ((pMVar12->flags & 0x9000) == 0) {
      pMVar12->flags = 1;
      return;
    }
    vdbeMemClearExternAndSetNull(pMVar12);
    return;
  }
  pMVar12->flags = 4;
  return;
}

Assistant:

static void jsonReturn(
  JsonNode *pNode,            /* Node to return */
  sqlite3_context *pCtx,      /* Return value for this function */
  sqlite3_value **aReplace    /* Array of replacement values */
){
  switch( pNode->eType ){
    default: {
      assert( pNode->eType==JSON_NULL );
      sqlite3_result_null(pCtx);
      break;
    }
    case JSON_TRUE: {
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSON_FALSE: {
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSON_INT: {
      sqlite3_int64 i = 0;
      const char *z;
      assert( pNode->eU==1 );
      z = pNode->u.zJContent;
      if( z[0]=='-' ){ z++; }
      while( z[0]>='0' && z[0]<='9' ){
        unsigned v = *(z++) - '0';
        if( i>=LARGEST_INT64/10 ){
          if( i>LARGEST_INT64/10 ) goto int_as_real;
          if( z[0]>='0' && z[0]<='9' ) goto int_as_real;
          if( v==9 ) goto int_as_real;
          if( v==8 ){
            if( pNode->u.zJContent[0]=='-' ){
              sqlite3_result_int64(pCtx, SMALLEST_INT64);
              goto int_done;
            }else{
              goto int_as_real;
            }
          }
        }
        i = i*10 + v;
      }
      if( pNode->u.zJContent[0]=='-' ){ i = -i; }
      sqlite3_result_int64(pCtx, i);
      int_done:
      break;
      int_as_real: ; /* no break */ deliberate_fall_through
    }
    case JSON_REAL: {
      double r;
#ifdef SQLITE_AMALGAMATION
      const char *z;
      assert( pNode->eU==1 );
      z = pNode->u.zJContent;
      sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
#else
      assert( pNode->eU==1 );
      r = strtod(pNode->u.zJContent, 0);
#endif
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSON_STRING: {
#if 0 /* Never happens because JNODE_RAW is only set by json_set(),
      ** json_insert() and json_replace() and those routines do not
      ** call jsonReturn() */
      if( pNode->jnFlags & JNODE_RAW ){
        assert( pNode->eU==1 );
        sqlite3_result_text(pCtx, pNode->u.zJContent, pNode->n,
                            SQLITE_TRANSIENT);
      }else
#endif
      assert( (pNode->jnFlags & JNODE_RAW)==0 );
      if( (pNode->jnFlags & JNODE_ESCAPE)==0 ){
        /* JSON formatted without any backslash-escapes */
        assert( pNode->eU==1 );
        sqlite3_result_text(pCtx, pNode->u.zJContent+1, pNode->n-2,
                            SQLITE_TRANSIENT);
      }else{
        /* Translate JSON formatted string into raw text */
        u32 i;
        u32 n = pNode->n;
        const char *z;
        char *zOut;
        u32 j;
        assert( pNode->eU==1 );
        z = pNode->u.zJContent;
        zOut = sqlite3_malloc( n+1 );
        if( zOut==0 ){
          sqlite3_result_error_nomem(pCtx);
          break;
        }
        for(i=1, j=0; i<n-1; i++){
          char c = z[i];
          if( c!='\\' ){
            zOut[j++] = c;
          }else{
            c = z[++i];
            if( c=='u' ){
              u32 v = jsonHexToInt4(z+i+1);
              i += 4;
              if( v==0 ) break;
              if( v<=0x7f ){
                zOut[j++] = (char)v;
              }else if( v<=0x7ff ){
                zOut[j++] = (char)(0xc0 | (v>>6));
                zOut[j++] = 0x80 | (v&0x3f);
              }else{
                u32 vlo;
                if( (v&0xfc00)==0xd800
                  && i<n-6
                  && z[i+1]=='\\'
                  && z[i+2]=='u'
                  && ((vlo = jsonHexToInt4(z+i+3))&0xfc00)==0xdc00
                ){
                  /* We have a surrogate pair */
                  v = ((v&0x3ff)<<10) + (vlo&0x3ff) + 0x10000;
                  i += 6;
                  zOut[j++] = 0xf0 | (v>>18);
                  zOut[j++] = 0x80 | ((v>>12)&0x3f);
                  zOut[j++] = 0x80 | ((v>>6)&0x3f);
                  zOut[j++] = 0x80 | (v&0x3f);
                }else{
                  zOut[j++] = 0xe0 | (v>>12);
                  zOut[j++] = 0x80 | ((v>>6)&0x3f);
                  zOut[j++] = 0x80 | (v&0x3f);
                }
              }
            }else{
              if( c=='b' ){
                c = '\b';
              }else if( c=='f' ){
                c = '\f';
              }else if( c=='n' ){
                c = '\n';
              }else if( c=='r' ){
                c = '\r';
              }else if( c=='t' ){
                c = '\t';
              }
              zOut[j++] = c;
            }
          }
        }
        zOut[j] = 0;
        sqlite3_result_text(pCtx, zOut, j, sqlite3_free);
      }
      break;
    }
    case JSON_ARRAY:
    case JSON_OBJECT: {
      jsonReturnJson(pNode, pCtx, aReplace);
      break;
    }
  }
}